

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void minstapetrify(monst *mon,boolean byplayer)

{
  boolean bVar1;
  
  if ((mon->mintrinsics & 0x80) != 0) {
    return;
  }
  bVar1 = poly_when_stoned(mon->data);
  if (bVar1 != '\0') {
    mon_to_stone(mon);
    return;
  }
  mon_adjust_speed(mon,-3,(obj *)0x0);
  if ((viz_array[mon->my][mon->mx] & 2U) != 0) {
    Monnam(mon);
    pline("%s turns to stone.");
  }
  if (byplayer != '\0') {
    stoned = '\x01';
    xkilled(mon,0);
    return;
  }
  monstone(mon);
  return;
}

Assistant:

void minstapetrify(struct monst *mon, boolean byplayer)
{
	if (resists_ston(mon)) return;
	if (poly_when_stoned(mon->data)) {
		mon_to_stone(mon);
		return;
	}

	/* give a "<mon> is slowing down" message and also remove
	   intrinsic speed (comparable to similar effect on the hero) */
	mon_adjust_speed(mon, -3, NULL);

	if (cansee(mon->mx, mon->my))
		pline("%s turns to stone.", Monnam(mon));
	if (byplayer) {
		stoned = TRUE;
		xkilled(mon,0);
	} else monstone(mon);
}